

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_free_list_rem(Tree *this,size_t i)

{
  code *pcVar1;
  bool bVar2;
  
  if (this->m_free_head == i) {
    if ((i == 0xffffffffffffffff) || (this->m_cap <= i)) {
      if ((s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_free_head = this->m_buf[i].m_next_sibling;
  }
  _rem_hierarchy(this,i);
  return;
}

Assistant:

void Tree::_free_list_rem(size_t i)
{
    if(m_free_head == i)
        m_free_head = _p(i)->m_next_sibling;
    _rem_hierarchy(i);
}